

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha)

{
  uint uVar1;
  float __x;
  int iVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = outw;
  if (outw < 1) {
    uVar1 = 0;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    __x = ((float)(int)uVar3 + 0.5) * (float)w * (1.0 / (float)outw) + -0.5;
    fVar4 = floorf(__x);
    iVar2 = (int)fVar4;
    fVar5 = 0.0;
    if (-1 < iVar2) {
      fVar5 = __x - (float)(int)fVar4;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (w + -1 <= iVar2) {
      fVar5 = 1.0;
      iVar2 = w + -2;
    }
    xofs[uVar3] = iVar2;
    alpha[uVar3 * 2] = 1.0 - fVar5;
    alpha[uVar3 * 2 + 1] = fVar5;
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }
}